

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O0

ChannelList *
anon_unknown.dwarf_1d2162::setupBuffer
          (Header *hdr,char **channels,char **passivechannels,PixelType *pt,FrameBuffer *buf,
          FrameBuffer *prereadbuf,FrameBuffer *postreadbuf,int banks,bool writing)

{
  Channel *pCVar1;
  Slice *pSVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  reference pvVar10;
  reference pvVar11;
  long in_RCX;
  long in_RDX;
  ChannelList *in_RDI;
  long in_R8;
  char *in_R9;
  bool bVar12;
  float fVar13;
  char *in_stack_00000008;
  char *in_stack_00000010;
  int in_stack_00000018;
  byte in_stack_00000020;
  char *pre_offset;
  int bank;
  PixelType type;
  int i_1;
  int first_pixel_index;
  int bytes_per_bank_row;
  int bytes_per_row;
  char *offset;
  half v;
  unsigned_short values;
  int i;
  int chan;
  char *write_ptr;
  int size;
  int samples;
  int bytes_per_bank;
  int chans;
  int passivechans;
  bool has32BitValue;
  int bytes_per_pixel;
  int activechans;
  Box2i dw;
  ChannelList *chanlist;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  size_type __n;
  reference local_1c0;
  PixelType local_1a4;
  float *local_1a0;
  int in_stack_fffffffffffffe74;
  Slice local_170 [56];
  char *local_138;
  Slice local_130 [56];
  Slice local_f8 [56];
  int local_c0;
  Channel local_b0 [16];
  PixelType local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  undefined1 local_89;
  char *local_88;
  uint16_t local_7e;
  half local_7c;
  uint16_t local_7a;
  int local_78;
  int local_74;
  float *local_70;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  char local_4d;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  byte local_31;
  char *local_30;
  long local_28;
  long local_20;
  long local_18;
  
  local_31 = in_stack_00000020 & 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  Imf_3_2::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  local_48 = 0;
  local_4c = 0;
  local_4d = '\0';
  while (*(long *)(local_18 + (long)local_48 * 8) != 0) {
    if (local_28 == 0) {
      local_4c = local_4c + 2;
    }
    else {
      iVar4 = *(int *)(local_28 + (long)local_48 * 4);
      if (iVar4 != 0) {
        if (iVar4 == 1) {
          local_4c = local_4c + 2;
          goto LAB_00204455;
        }
        if (iVar4 != 2) {
          std::operator<<((ostream *)&std::cout,"Unexpected PixelType?\n");
          exit(1);
        }
      }
      local_4c = alignToFour<int>(local_4c);
      local_4c = local_4c + 4;
      local_4d = '\x01';
    }
LAB_00204455:
    local_48 = local_48 + 1;
  }
  local_54 = 0;
  do {
    bVar12 = false;
    if (local_20 != 0) {
      bVar12 = *(long *)(local_20 + (long)local_54 * 8) != 0;
    }
    if (!bVar12) {
      if (local_4d != '\0') {
        local_4c = alignToFour<int>(local_4c);
      }
      local_58 = local_48 + local_54;
      local_5c = local_4c / in_stack_00000018;
      lVar8 = Imf_3_2::Header::dataWindow();
      iVar4 = *(int *)(lVar8 + 8) + 1;
      piVar9 = (int *)Imf_3_2::Header::dataWindow();
      iVar5 = iVar4 - *piVar9;
      lVar8 = Imf_3_2::Header::dataWindow();
      iVar6 = *(int *)(lVar8 + 0xc) + 1;
      lVar8 = Imf_3_2::Header::dataWindow();
      local_60 = iVar5 * (iVar6 - *(int *)(lVar8 + 4)) * local_58;
      local_64 = local_60 * local_4c;
      if ((local_31 & 1) == 0) {
        std::vector<char,_std::allocator<char>_>::resize
                  (in_stack_fffffffffffffdf0,
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      }
      else {
        std::vector<char,_std::allocator<char>_>::resize
                  (in_stack_fffffffffffffdf0,
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      }
      if ((local_31 & 1) == 0) {
        local_1a0 = (float *)std::vector<char,_std::allocator<char>_>::operator[]
                                       ((vector<char,_std::allocator<char>_> *)
                                        (anonymous_namespace)::readingBuffer,0);
      }
      else {
        local_1a0 = (float *)std::vector<char,_std::allocator<char>_>::operator[]
                                       ((vector<char,_std::allocator<char>_> *)
                                        (anonymous_namespace)::writingBuffer,0);
      }
      local_70 = local_1a0;
      local_74 = 0;
      for (local_78 = 0; local_78 < local_60; local_78 = local_78 + 1) {
        std::numeric_limits<unsigned_short>::max();
        iVar7 = random_int(in_stack_fffffffffffffdd4);
        local_7a = (uint16_t)iVar7;
        Imath_3_2::half::setBits(&local_7c,local_7a);
        if ((local_28 == 0) || (*(int *)(local_28 + (long)local_74 * 4) == 1)) {
          local_7e = local_7c._h;
          *(uint16_t *)local_70 = local_7c._h;
          local_70 = (float *)((long)local_70 + 2);
        }
        else {
          local_70 = (float *)(anonymous_namespace)::alignToFour<char_const*>((char *)local_70);
          fVar13 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0))
          ;
          *local_70 = fVar13;
          local_70 = local_70 + 1;
        }
        local_74 = local_74 + 1;
        if (local_74 == local_58) {
          local_74 = 0;
        }
      }
      if ((local_31 & 1) == 0) {
        std::vector<char,_std::allocator<char>_>::operator=
                  ((vector<char,_std::allocator<char>_> *)CONCAT44(in_stack_fffffffffffffe74,iVar5),
                   (vector<char,_std::allocator<char>_> *)CONCAT44(iVar6,iVar4));
      }
      local_88 = (char *)0x0;
      local_89 = 0;
      Imf_3_2::ChannelList::ChannelList((ChannelList *)0x20486e);
      local_90 = local_4c * ((local_3c + 1) - local_44);
      local_94 = local_90 / in_stack_00000018;
      local_98 = local_90 * local_40 + local_5c * local_44;
      local_9c = 0;
      do {
        if (local_58 <= local_9c) {
          return in_RDI;
        }
        if (local_28 == 0) {
          local_1a4 = HALF;
        }
        else {
          local_1a4 = *(PixelType *)(local_28 + (long)local_9c * 4);
        }
        local_a0 = local_1a4;
        if ((local_9c < local_48) && ((local_31 & 1) != 0)) {
          pCVar1 = *(Channel **)(local_18 + (long)local_9c * 8);
          Imf_3_2::Channel::Channel(local_b0,local_1a4,1,1,false);
          Imf_3_2::ChannelList::insert((char *)in_RDI,pCVar1);
        }
        if (local_9c % (local_58 / in_stack_00000018) == 0) {
          local_c0 = local_9c / (local_58 / in_stack_00000018);
          if ((local_31 & 1) == 0) {
            local_1c0 = std::vector<char,_std::allocator<char>_>::operator[]
                                  ((vector<char,_std::allocator<char>_> *)
                                   (anonymous_namespace)::readingBuffer,0);
          }
          else {
            local_1c0 = std::vector<char,_std::allocator<char>_>::operator[]
                                  ((vector<char,_std::allocator<char>_> *)
                                   (anonymous_namespace)::writingBuffer,0);
          }
          local_88 = local_1c0 + ((long)(local_c0 * local_94) - (long)local_98);
        }
        if ((local_a0 == FLOAT) || (local_a0 == UINT)) {
          local_88 = (anonymous_namespace)::alignToFour<char*>(local_88);
        }
        pcVar3 = local_30;
        if (local_9c < local_48) {
          pSVar2 = *(Slice **)(local_18 + (long)local_9c * 8);
          Imf_3_2::Slice::Slice
                    (local_f8,local_a0,local_88,(long)local_5c,(long)local_90,1,1,
                     (double)(local_9c + 100),false,false);
          Imf_3_2::FrameBuffer::insert(pcVar3,pSVar2);
        }
        else if ((local_31 & 1) == 0) {
          pSVar2 = *(Slice **)(local_20 + (long)(local_9c - local_48) * 8);
          Imf_3_2::Slice::Slice
                    (local_130,local_a0,local_88,(long)local_5c,(long)local_90,1,1,0.4,false,false);
          Imf_3_2::FrameBuffer::insert(in_stack_00000010,pSVar2);
          pcVar3 = local_88;
          __n = 0;
          pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)
                               (anonymous_namespace)::readingBuffer,0);
          pvVar11 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)
                               (anonymous_namespace)::preReadBuffer,__n);
          local_138 = pvVar11 + ((long)pcVar3 - (long)pvVar10);
          pSVar2 = *(Slice **)(local_20 + (long)(local_9c - local_48) * 8);
          Imf_3_2::Slice::Slice
                    (local_170,local_a0,local_138,(long)local_5c,(long)local_90,1,1,0.4,false,false)
          ;
          Imf_3_2::FrameBuffer::insert(in_stack_00000008,pSVar2);
        }
        if (local_a0 == HALF) {
          local_88 = local_88 + 2;
        }
        else {
          if (local_a0 != FLOAT) {
            std::operator<<((ostream *)&std::cout,"Unexpected Pixel Type\n");
            exit(1);
          }
          local_88 = local_88 + 4;
        }
        local_9c = local_9c + 1;
      } while( true );
    }
    if (local_28 == 0) {
      local_4c = local_4c + 2;
    }
    else {
      in_stack_fffffffffffffe74 = *(int *)(local_28 + (long)(local_54 + local_48) * 4);
      if (in_stack_fffffffffffffe74 != 0) {
        if (in_stack_fffffffffffffe74 == 1) {
          local_4c = local_4c + 2;
          goto LAB_00204581;
        }
        if (in_stack_fffffffffffffe74 != 2) {
          std::operator<<((ostream *)&std::cout,"Unexpected PixelType?\n");
          exit(1);
        }
      }
      local_4c = alignToFour<int>(local_4c);
      local_4c = local_4c + 4;
      local_4d = '\x01';
    }
LAB_00204581:
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

ChannelList
setupBuffer (
    const Header&      hdr,      // header to grab datawindow from
    const char* const* channels, // NULL terminated list of channels to write
    const char* const*
        passivechannels,  // NULL terminated list of channels to write
    const PixelType* pt,  // type of each channel, or NULL for all HALF
    FrameBuffer&     buf, // buffer to fill with pointers to channel
    FrameBuffer&
        prereadbuf, // channels which aren't being read - indexes into the preread buffer
    FrameBuffer&
         postreadbuf, // channels which aren't being read - indexes into the postread buffer
    int  banks, // number of banks - channels within each bank are interleaved, banks are scanline interleaved
    bool writing // true if should allocate
)
{
    Box2i dw = hdr.dataWindow ();

    //
    // how many channels in total
    //
    int  activechans     = 0;
    int  bytes_per_pixel = 0;
    bool has32BitValue   = false;
    while (channels[activechans] != NULL)
    {
        if (pt == NULL) { bytes_per_pixel += 2; }
        else
        {
            switch (pt[activechans])
            {
                case IMF::HALF: bytes_per_pixel += 2; break;
                case IMF::FLOAT:
                case IMF::UINT:
                    // some architectures (e.g arm7 cannot write 32 bit values
                    // to addresses which aren't aligned to 32 bit addresses)
                    // so bump to next multiple of four
                    bytes_per_pixel = alignToFour (bytes_per_pixel);
                    bytes_per_pixel += 4;
                    has32BitValue = true;
                    break;

                default: cout << "Unexpected PixelType?\n"; exit (1);
            }
        }
        activechans++;
    }

    int passivechans = 0;
    while (passivechannels != NULL && passivechannels[passivechans] != NULL)
    {
        if (pt == NULL) { bytes_per_pixel += 2; }
        else
        {
            switch (pt[passivechans + activechans])
            {
                case IMF::HALF: bytes_per_pixel += 2; break;
                case IMF::FLOAT:
                case IMF::UINT:
                    bytes_per_pixel = alignToFour (bytes_per_pixel);
                    bytes_per_pixel += 4;
                    has32BitValue = true;
                    break;
                default: cout << "Unexpected PixelType?\n"; exit (1);
            }
        }
        passivechans++;
    }

    if (has32BitValue) { bytes_per_pixel = alignToFour (bytes_per_pixel); }

    int chans = activechans + passivechans;

    int bytes_per_bank = bytes_per_pixel / banks;

    int samples = (hdr.dataWindow ().max.x + 1 - hdr.dataWindow ().min.x) *
                  (hdr.dataWindow ().max.y + 1 - hdr.dataWindow ().min.y) *
                  chans;

    int size = samples * bytes_per_pixel;

    if (writing) { writingBuffer.resize (size); }
    else
    {
        readingBuffer.resize (size);
    }

    const char* write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
    // fill with random halfs, casting to floats for float channels
    int chan = 0;
    for (int i = 0; i < samples; i++)
    {
        unsigned short int values =
            random_int (std::numeric_limits<unsigned short>::max ());
        half v;
        v.setBits (values);
        if (pt == NULL || pt[chan] == IMF::HALF)
        {
            *(half*) write_ptr = half (v);
            write_ptr += 2;
        }
        else
        {
            write_ptr           = alignToFour (write_ptr);
            *(float*) write_ptr = float (v);

            write_ptr += 4;
        }
        chan++;
        if (chan == chans) { chan = 0; }
    }

    if (!writing)
    {
        //take a copy of the buffer as it was before being read
        preReadBuffer = readingBuffer;
    }

    char* offset = NULL;

    ChannelList chanlist;

    int bytes_per_row      = bytes_per_pixel * (dw.max.x + 1 - dw.min.x);
    int bytes_per_bank_row = bytes_per_row / banks;

    int first_pixel_index =
        bytes_per_row * dw.min.y + bytes_per_bank * dw.min.x;

    for (int i = 0; i < chans; i++)
    {
        PixelType type = pt == NULL ? IMF::HALF : pt[i];
        if (i < activechans && writing) { chanlist.insert (channels[i], type); }

        if (i % (chans / banks) == 0)
        {
            //
            // set offset pointer to beginning of bank
            //

            int bank = i / (chans / banks);
            offset   = (writing ? &writingBuffer[0] : &readingBuffer[0]) +
                     bank * bytes_per_bank_row - first_pixel_index;
        }

        if (type == FLOAT || type == UINT) { offset = alignToFour (offset); }

        if (i < activechans)
        {

            buf.insert (
                channels[i],
                Slice (
                    type,
                    offset,
                    bytes_per_bank,
                    bytes_per_row,
                    1,
                    1,
                    100 + i));
        }
        else
        {
            if (!writing)
            {

                postreadbuf.insert (
                    passivechannels[i - activechans],
                    Slice (
                        type,
                        offset,
                        bytes_per_bank,
                        bytes_per_row,
                        1,
                        1,
                        0.4));

                char* pre_offset =
                    offset - &readingBuffer[0] + &preReadBuffer[0];

                prereadbuf.insert (
                    passivechannels[i - activechans],
                    Slice (
                        type,
                        pre_offset,
                        bytes_per_bank,
                        bytes_per_row,
                        1,
                        1,
                        0.4));
            }
        }
        switch (type)
        {
            case IMF::HALF: offset += 2; break;
            case IMF::FLOAT: offset += 4; break;
            default: cout << "Unexpected Pixel Type\n"; exit (1);
        }
    }

    return chanlist;
}